

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O1

Expression __thiscall
dynet::SimpleRNNBuilder::add_auxiliary_input(SimpleRNNBuilder *this,Expression *in,Expression *aux)

{
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *this_00;
  pointer pvVar1;
  pointer pvVar2;
  undefined8 *puVar3;
  pointer pEVar4;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar5;
  long lVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  Expression x;
  initializer_list<dynet::Expression> local_108;
  Expression local_f8;
  ComputationGraph *local_e8;
  undefined8 uStack_e0;
  Expression *local_d0;
  ulong local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_a8;
  undefined8 uStack_90;
  ComputationGraph *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ComputationGraph *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_00 = &this->h;
  pvVar1 = (this->h).
           super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (this->h).
           super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d0 = aux;
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            (&local_a8,(ulong)this->layers,(allocator_type *)&local_e8);
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)this_00,&local_a8);
  if ((ComputationGraph *)
      local_a8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_start != (ComputationGraph *)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_c8 = ((long)pvVar1 - (long)pvVar2 >> 3) * -0x5555555555555555;
  local_e8 = in->pg;
  uStack_e0._0_4_ = in->i;
  uStack_e0._4_4_ = in->graph_id;
  if (this->layers != 0) {
    local_b0 = local_c8 & 0xffffffff;
    lVar8 = 0;
    local_b8 = (ulong)((int)local_c8 - 1) * 3;
    local_c0 = local_b0 * 3;
    lVar10 = 0;
    uVar9 = 0;
    do {
      pvVar1 = (this->param_vars).
               super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_b0 == 0) {
        pEVar4 = (this->h0).
                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
            _M_impl.super__Vector_impl_data._M_finish == pEVar4) {
          lVar6 = *(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                   )._M_impl.super__Vector_impl_data + lVar10);
          local_a8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
          .super__Vector_impl_data._M_start = *(pointer *)(lVar6 + 0x20);
          local_a8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
          .super__Vector_impl_data._M_finish = *(pointer *)(lVar6 + 0x28);
          puVar3 = *(undefined8 **)
                    ((long)&(pvVar1->
                            super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                            )._M_impl.super__Vector_impl_data + lVar10);
          local_a8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)*puVar3;
          uStack_90 = puVar3[1];
          lVar6 = *(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                   )._M_impl.super__Vector_impl_data + lVar10);
          local_78 = *(undefined8 *)(lVar6 + 0x30);
          uStack_70 = *(undefined8 *)(lVar6 + 0x38);
          local_68 = local_d0->pg;
          uStack_60._0_4_ = local_d0->i;
          uStack_60._4_4_ = local_d0->graph_id;
          local_108._M_len = 5;
        }
        else {
          lVar6 = *(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                   )._M_impl.super__Vector_impl_data + lVar10);
          local_a8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
          .super__Vector_impl_data._M_start = *(pointer *)(lVar6 + 0x20);
          local_a8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
          .super__Vector_impl_data._M_finish = *(pointer *)(lVar6 + 0x28);
          puVar3 = *(undefined8 **)
                    ((long)&(pvVar1->
                            super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                            )._M_impl.super__Vector_impl_data + lVar10);
          local_a8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)*puVar3;
          uStack_90 = puVar3[1];
          lVar6 = *(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                   )._M_impl.super__Vector_impl_data + lVar10);
          local_78 = *(undefined8 *)(lVar6 + 0x30);
          uStack_70 = *(undefined8 *)(lVar6 + 0x38);
          local_68 = local_d0->pg;
          uStack_60._0_4_ = local_d0->i;
          uStack_60._4_4_ = local_d0->graph_id;
          lVar6 = *(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                   )._M_impl.super__Vector_impl_data + lVar10);
          local_58 = *(undefined8 *)(lVar6 + 0x10);
          uStack_50 = *(undefined8 *)(lVar6 + 0x18);
          puVar3 = (undefined8 *)((long)&pEVar4->pg + lVar8);
          local_48 = *puVar3;
          uStack_40 = puVar3[1];
          local_108._M_len = 7;
        }
        local_108._M_array = (iterator)&local_a8;
        uStack_80 = uStack_e0;
        local_88 = local_e8;
        local_f8 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                             (&local_108);
        tanh((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        lVar6 = *(long *)&(((this_00->
                            super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)
                          ._M_impl;
        uVar5 = extraout_RAX_00;
        uVar7 = extraout_RDX_00;
      }
      else {
        lVar6 = *(long *)((long)&(pvVar1->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar10);
        local_a8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(lVar6 + 0x20);
        local_a8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
        super__Vector_impl_data._M_finish = *(pointer *)(lVar6 + 0x28);
        puVar3 = *(undefined8 **)
                  ((long)&(pvVar1->
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>)
                          ._M_impl.super__Vector_impl_data + lVar10);
        local_a8.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*puVar3;
        uStack_90 = puVar3[1];
        local_88 = local_e8;
        uStack_80 = uStack_e0;
        lVar6 = *(long *)((long)&(pvVar1->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar10);
        local_78 = *(undefined8 *)(lVar6 + 0x30);
        uStack_70 = *(undefined8 *)(lVar6 + 0x38);
        local_68 = local_d0->pg;
        uStack_60._0_4_ = local_d0->i;
        uStack_60._4_4_ = local_d0->graph_id;
        lVar6 = *(long *)((long)&(pvVar1->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl.super__Vector_impl_data + lVar10);
        local_58 = *(undefined8 *)(lVar6 + 0x10);
        uStack_50 = *(undefined8 *)(lVar6 + 0x18);
        puVar3 = (undefined8 *)
                 (*(long *)((long)&(((this_00->
                                     super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                   )._M_impl + local_b8 * 8) + lVar8);
        local_48 = *puVar3;
        uStack_40 = puVar3[1];
        local_108._M_array = (iterator)&local_a8;
        local_108._M_len = 7;
        local_f8 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                             (&local_108);
        tanh((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        lVar6 = *(long *)((long)&(((this_00->
                                   super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl + local_c0 * 8);
        uVar5 = extraout_RAX;
        uVar7 = extraout_RDX;
      }
      *(undefined8 *)(lVar6 + lVar8) = uVar5;
      *(undefined8 *)(lVar6 + 8 + lVar8) = uVar7;
      local_e8 = *(ComputationGraph **)(lVar6 + lVar8);
      uStack_e0 = ((undefined8 *)(lVar6 + lVar8))[1];
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x18;
      lVar8 = lVar8 + 0x10;
    } while (uVar9 < this->layers);
  }
  return (*(pointer *)
           ((long)&(this_00->
                   super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[local_c8 & 0xffffffff].
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
           + 8))[-1];
}

Assistant:

Expression SimpleRNNBuilder::add_auxiliary_input(const Expression &in, const Expression &aux) {
  const unsigned t = h.size();
  h.push_back(vector<Expression>(layers));

  Expression x = in;

  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    DYNET_ASSERT(vars.size() >= L2H + 1, "Failed dimension check in SimpleRNNBuilder");

    if(t > 0) {
      x = h[t][i] = tanh( affine_transform({vars[HB], vars[X2H], x, vars[L2H], aux, vars[H2H], h[t-1][i]}) );
    } else if(h0.size() > 0) {
      x = h[t][i] = tanh( affine_transform({vars[HB], vars[X2H], x, vars[L2H], aux, vars[H2H], h0[i]}) );
    } else {
      x = h[t][i] = tanh( affine_transform({vars[HB], vars[X2H], x, vars[L2H], aux}) );
    }

  }
  return h[t].back();
}